

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_checkPiTarget(ENCODING *UNUSED_enc,char *ptr,char *end,int *tokPtr)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  
  end[0] = '\v';
  end[1] = '\0';
  end[2] = '\0';
  end[3] = '\0';
  iVar3 = 1;
  if ((long)ptr - (long)UNUSED_enc == 3) {
    if (*(char *)UNUSED_enc->scanners == 'x') {
      bVar2 = false;
    }
    else {
      if (*(char *)UNUSED_enc->scanners != 'X') {
        return 1;
      }
      bVar2 = true;
    }
    cVar1 = *(char *)((long)UNUSED_enc->scanners + 1);
    if (cVar1 != 'm') {
      if (cVar1 != 'M') {
        return 1;
      }
      bVar2 = true;
    }
    cVar1 = *(char *)((long)UNUSED_enc->scanners + 2);
    if (cVar1 != 'l') {
      if (cVar1 != 'L') {
        return 1;
      }
      bVar2 = true;
    }
    iVar3 = 0;
    if (!bVar2) {
      end[0] = '\f';
      end[1] = '\0';
      end[2] = '\0';
      end[3] = '\0';
      return 1;
    }
  }
  return iVar3;
}

Assistant:

static int PTRCALL
PREFIX(checkPiTarget)(const ENCODING *UNUSED_P(enc), const char *ptr,
                      const char *end, int *tokPtr)
{
  int upper = 0;
  *tokPtr = XML_TOK_PI;
  if (end - ptr != MINBPC(enc)*3)
    return 1;
  switch (BYTE_TO_ASCII(enc, ptr)) {
  case ASCII_x:
    break;
  case ASCII_X:
    upper = 1;
    break;
  default:
    return 1;
  }
  ptr += MINBPC(enc);
  switch (BYTE_TO_ASCII(enc, ptr)) {
  case ASCII_m:
    break;
  case ASCII_M:
    upper = 1;
    break;
  default:
    return 1;
  }
  ptr += MINBPC(enc);
  switch (BYTE_TO_ASCII(enc, ptr)) {
  case ASCII_l:
    break;
  case ASCII_L:
    upper = 1;
    break;
  default:
    return 1;
  }
  if (upper)
    return 0;
  *tokPtr = XML_TOK_XML_DECL;
  return 1;
}